

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

VulkanDynamicAllocation * __thiscall
Diligent::DeviceContextVkImpl::AllocateDynamicSpace
          (VulkanDynamicAllocation *__return_storage_ptr__,DeviceContextVkImpl *this,
          Uint64 SizeInBytes,Uint32 Alignment)

{
  string msg;
  string local_48;
  
  if (0xfffffffe < SizeInBytes) {
    FormatString<char[47]>
              (&local_48,(char (*) [47])"Dynamic allocation size must be less than 2^32");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AllocateDynamicSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  VulkanDynamicHeap::Allocate
            (__return_storage_ptr__,&this->m_DynamicHeap,(Uint32)SizeInBytes,Alignment);
  __return_storage_ptr__->dvpFrameNumber =
       (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FrameNumber;
  return __return_storage_ptr__;
}

Assistant:

VulkanDynamicAllocation DeviceContextVkImpl::AllocateDynamicSpace(Uint64 SizeInBytes, Uint32 Alignment)
{
    DEV_CHECK_ERR(SizeInBytes < std::numeric_limits<Uint32>::max(),
                  "Dynamic allocation size must be less than 2^32");

    VulkanDynamicAllocation DynAlloc = m_DynamicHeap.Allocate(static_cast<Uint32>(SizeInBytes), Alignment);
#ifdef DILIGENT_DEVELOPMENT
    DynAlloc.dvpFrameNumber = GetFrameNumber();
#endif
    return DynAlloc;
}